

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall.c
# Opt level: O2

void * metacallhv_s(void *handle,char *name,void **args,size_t size)

{
  int iVar1;
  type_id tVar2;
  loader_data v;
  function func;
  void *pvVar3;
  
  iVar1 = loader_impl_handle_validate(handle);
  if (iVar1 != 0) {
    log_write_impl_va("metacall",0x21d,"metacallhv_s",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/metacall/source/metacall.c"
                      ,LOG_LEVEL_ERROR,"Handle %p passed to metacallhv_s is not valid",handle);
    return (void *)0x0;
  }
  v = loader_handle_get(handle,name);
  tVar2 = value_type_id(v);
  if (tVar2 == 0xd) {
    func = value_to_function(v);
  }
  else {
    func = (function)0x0;
  }
  pvVar3 = metacallfv_s(func,args,size);
  return pvVar3;
}

Assistant:

void *metacallhv_s(void *handle, const char *name, void *args[], size_t size)
{
	if (loader_impl_handle_validate(handle) != 0)
	{
		// TODO: Implement type error return a value
		log_write("metacall", LOG_LEVEL_ERROR, "Handle %p passed to metacallhv_s is not valid", handle);
		return NULL;
	}

	value f_val = loader_handle_get(handle, name);
	function f = NULL;

	if (value_type_id(f_val) == TYPE_FUNCTION)
	{
		f = value_to_function(f_val);
	}

	return metacallfv_s(f, args, size);
}